

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_file.hpp
# Opt level: O2

int __thiscall io::posix::mmap_file::open(mmap_file *this,char *__file,int __oflag,...)

{
  char *__file_00;
  int iVar1;
  int *piVar2;
  __off_t size;
  error_category *peVar3;
  error_category *extraout_RAX;
  uint in_ECX;
  error_code *in_R8;
  file_descriptor_handle new_fd;
  mmap_handle mmap;
  
  std::error_code::clear(in_R8);
  piVar2 = __errno_location();
  *piVar2 = 0;
  __file_00 = *(char **)__file;
  iVar1 = detail::open_mode_to_posix_mode(__oflag);
  new_fd.fd_ = ::open(__file_00,iVar1,(ulong)in_ECX);
  if (new_fd.fd_ < 0) {
    iVar1 = *piVar2;
    peVar3 = (error_category *)std::_V2::system_category();
    in_R8->_M_value = iVar1;
    in_R8->_M_cat = peVar3;
  }
  else {
    new_fd.delete_ = true;
    size = lseek(new_fd.fd_,0,2);
    if (size == -1) {
      iVar1 = *piVar2;
      peVar3 = (error_category *)std::_V2::system_category();
      in_R8->_M_value = iVar1;
      in_R8->_M_cat = peVar3;
    }
    else {
      detail::mmap_handle::create(&mmap,&new_fd,size,__oflag,in_R8);
      if (in_R8->_M_value == 0) {
        detail::mmap_handle::operator=(&this->mmap_,&mmap);
      }
      detail::mmap_handle::~mmap_handle(&mmap);
    }
    file_descriptor_handle::~file_descriptor_handle(&new_fd);
    peVar3 = extraout_RAX;
  }
  return (int)peVar3;
}

Assistant:

void open(const io_std::filesystem::path& path,
              open_mode mode,
              io_std::filesystem::perms create_perms,
              std::error_code& ec) noexcept
    {
        ec.clear();
        errno = 0;

        // First, try to open the file
        int raw_fd = ::open(path.c_str(), detail::open_mode_to_posix_mode(mode),
                            static_cast<::mode_t>(create_perms));
        if (raw_fd < 0) {
            ec.assign(errno, std::system_category());
            return;
        }
        file_descriptor_handle new_fd{raw_fd};

        // Now seek to the end to find the file size
        offset_type size = ::lseek(new_fd.get(), 0, SEEK_END);
        if (size == -1) {
            ec.assign(errno, std::system_category());
            return;
        }

        auto mmap = detail::mmap_handle::create(new_fd, size, mode, ec);
        if (ec) {
            return;
        }

        this->mmap_ = std::move(mmap);
    }